

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_checked.hh
# Opt level: O1

uint64_t __thiscall doublechecked::Roaring::rank(Roaring *this,uint32_t x)

{
  uint64_t uVar1;
  _Rb_tree_node_base *p_Var2;
  uint64_t uVar3;
  
  uVar1 = roaring_bitmap_rank((roaring_bitmap_t *)this,x);
  uVar3 = 0;
  for (p_Var2 = (this->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      ((_Rb_tree_header *)p_Var2 != &(this->check)._M_t._M_impl.super__Rb_tree_header &&
      (p_Var2[1]._M_color <= x)); p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    uVar3 = uVar3 + 1;
  }
  _assert_true((ulong)(uVar1 == uVar3),"ans == count",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring_checked.hh"
               ,0x249);
  return uVar1;
}

Assistant:

uint64_t rank(uint32_t x) const {
        uint64_t ans = plain.rank(x);

        uint64_t count = 0;
        auto it = check.begin();
        auto it_end = check.end();
        for (; it != it_end && *it <= x; ++it) ++count;
        assert_true(ans == count);

        return ans;
    }